

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall
wasm::LocalGraphFlower::computeSetInfluences
          (LocalGraphFlower *this,LocalSet *set,SetInfluencesMap *setInfluences)

{
  uint uVar1;
  pointer pvVar2;
  pointer ppLVar3;
  pointer pvVar4;
  pointer ppLVar5;
  bool bVar6;
  size_type sVar7;
  size_type sVar8;
  _Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  _Base_ptr p_Var9;
  pointer ppLVar10;
  pointer ppLVar11;
  undefined1 local_a0 [8];
  Iterator __end3;
  LocalSet *set_local;
  LocalGet *get_1;
  LocalSet *set_2;
  LocalSet *local_60;
  undefined1 local_58 [8];
  LocalGet *get;
  size_t local_48;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_40;
  LocalGraphFlower *local_38;
  
  uVar1 = set->index;
  __end3.flexibleIterator._M_node = (_Base_ptr)set;
  sVar7 = std::
          _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&setInfluences->_M_h,(key_type *)&__end3.flexibleIterator);
  if (sVar7 == 0) {
    pvVar2 = (this->getsByIndex).
             super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppLVar3 = *(pointer *)
               ((long)&pvVar2[uVar1].
                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                       _M_impl.super__Vector_impl_data + 8);
    local_38 = this;
    for (ppLVar10 = pvVar2[uVar1].
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppLVar10 != ppLVar3; ppLVar10 = ppLVar10 + 1)
    {
      local_58 = (undefined1  [8])*ppLVar10;
      sVar8 = std::
              _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&local_38->getSetsMap->_M_h,(key_type *)local_58);
      if (sVar8 == 0) {
        computeGetSets(local_38,(LocalGet *)local_58);
      }
    }
    pvVar4 = (local_38->setsByIndex).
             super__Vector_base<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>,_std::allocator<std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = *(pointer *)
               ((long)&pvVar4[uVar1].
                       super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                       _M_impl.super__Vector_impl_data + 8);
    for (ppLVar11 = pvVar4[uVar1].
                    super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppLVar11 != ppLVar5; ppLVar11 = ppLVar11 + 1)
    {
      local_58 = (undefined1  [8])*ppLVar11;
      std::__detail::
      _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)setInfluences,(key_type *)local_58);
    }
    std::__detail::
    _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)setInfluences,(key_type *)&__end3.flexibleIterator);
    pvVar2 = (local_38->getsByIndex).
             super__Vector_base<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>,_std::allocator<std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_60 = *(LocalSet **)
                ((long)&pvVar2[uVar1].
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                        _M_impl.super__Vector_impl_data + 8);
    for (set_2 = *(LocalSet **)
                  &pvVar2[uVar1].
                   super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
                   super__Vector_impl_data; set_2 != local_60;
        set_2 = (LocalSet *)
                &(set_2->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type) {
      set_local = *(LocalSet **)
                   &(set_2->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression;
      local_58 = (undefined1  [8])
                 std::__detail::
                 _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_38->getSetsMap,(key_type *)&set_local);
      local_40._M_node = (_Base_ptr)0x0;
      get._0_1_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     *)local_58)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
      if ((bool)(char)get) {
        local_48 = 0;
      }
      else {
        local_40._M_node =
             (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)local_58)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::end((Iterator *)local_a0,
            (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             *)local_58);
      while( true ) {
        bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::
                IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                              *)local_58,(Iterator *)local_a0);
        if (!bVar6) break;
        p_Var9 = local_40._M_node + 1;
        if ((char)get != '\0') {
          p_Var9 = (_Base_ptr)
                   ((((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)local_58)->
                    super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + local_48);
        }
        get_1 = *(LocalGet **)p_Var9;
        this_00 = (_Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)std::__detail::
                     _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)setInfluences,(key_type *)&get_1);
        std::__detail::
        _Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert(this_00,(value_type *)&set_local);
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::
        IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
        ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                      *)local_58);
      }
    }
    return;
  }
  __assert_fail("!setInfluences.count(set)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0x19c,
                "void wasm::LocalGraphFlower::computeSetInfluences(LocalSet *, LocalGraphBase::SetInfluencesMap &)"
               );
}

Assistant:

void computeSetInfluences(LocalSet* set,
                            LocalGraphBase::SetInfluencesMap& setInfluences) {
    auto index = set->index;

    // We must never repeat work.
    assert(!setInfluences.count(set));

    // In theory we could flow the set forward, but to keep things simple we
    // reuse the logic for flowing gets backwards: We flow all the gets of the
    // set's index, thus fully computing that index and all its sets, including
    // this one. This is not 100% lazy, but still avoids extra work by never
    // doing work for local indexes we don't care about.
    for (auto* get : getsByIndex[index]) {
      // Don't repeat work.
      if (!getSetsMap.count(get)) {
        computeGetSets(get);
      }
    }

    // Ensure empty entries for each set of this index, to mark them as
    // computed.
    for (auto* set : setsByIndex[index]) {
      setInfluences[set];
    }

    // Also ensure |set| itself, that we were originally asked about. It may be
    // in unreachable code, which means it is not listed in setsByIndex.
    setInfluences[set];

    // Apply the info from the gets to the sets.
    for (auto* get : getsByIndex[index]) {
      for (auto* set : getSetsMap[get]) {
        setInfluences[set].insert(get);
      }
    }
  }